

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int udp_ep_get_recvmaxsz(void *arg,void *v,size_t *szp,nni_opt_type t)

{
  int iVar1;
  int rv;
  udp_ep *ep;
  nni_opt_type t_local;
  size_t *szp_local;
  void *v_local;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 8));
  iVar1 = nni_copyout_size((ulong)*(ushort *)((long)arg + 0xa30),v,szp,t);
  nni_mtx_unlock((nni_mtx *)((long)arg + 8));
  return iVar1;
}

Assistant:

static int
udp_ep_get_recvmaxsz(void *arg, void *v, size_t *szp, nni_opt_type t)
{
	udp_ep *ep = arg;
	int     rv;

	nni_mtx_lock(&ep->mtx);
	rv = nni_copyout_size(ep->rcvmax, v, szp, t);
	nni_mtx_unlock(&ep->mtx);
	return (rv);
}